

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TimingControl.cpp
# Opt level: O0

TimingControl *
slang::ast::Delay3Control::fromParams
          (Compilation *compilation,ParameterValueAssignmentSyntax *exprs,ASTContext *context)

{
  SourceRange *pSVar1;
  ulong uVar2;
  bool bVar3;
  int iVar4;
  SeparatedSyntaxList<slang::syntax::ParamAssignmentSyntax> *this;
  size_t sVar5;
  TimingControl *pTVar6;
  ParamAssignmentSyntax *pPVar7;
  SyntaxNode *pSVar8;
  OrderedParamAssignmentSyntax *pOVar9;
  ExpressionSyntax *pEVar10;
  undefined4 extraout_var;
  Type *pTVar11;
  Diagnostic *diag;
  Delay3Control *pDVar12;
  SourceRange sourceRange;
  SourceRange local_b8;
  SourceLocation local_a8;
  SourceLocation local_a0;
  undefined4 local_94;
  bitmask<slang::ast::ASTFlags> local_90;
  SourceRange local_88;
  DiagCode local_74;
  ulong local_70;
  size_t i;
  Expression *delays [3];
  SeparatedSyntaxList<slang::syntax::ParamAssignmentSyntax> *items;
  ASTContext *context_local;
  ParameterValueAssignmentSyntax *exprs_local;
  Compilation *compilation_local;
  
  this = &exprs->parameters;
  sVar5 = slang::syntax::SeparatedSyntaxList<slang::syntax::ParamAssignmentSyntax>::size(this);
  if ((sVar5 != 0) &&
     (sVar5 = slang::syntax::SeparatedSyntaxList<slang::syntax::ParamAssignmentSyntax>::size(this),
     sVar5 < 4)) {
    memset(&i,0,0x18);
    local_70 = 0;
    while( true ) {
      uVar2 = local_70;
      sVar5 = slang::syntax::SeparatedSyntaxList<slang::syntax::ParamAssignmentSyntax>::size(this);
      if (sVar5 <= uVar2) {
        if (i != 0) {
          local_b8 = slang::syntax::SyntaxNode::sourceRange
                               (&(exprs->parameters).super_SyntaxListBase.super_SyntaxNode);
          pDVar12 = BumpAllocator::
                    emplace<slang::ast::Delay3Control,slang::ast::Expression_const&,slang::ast::Expression_const*&,slang::ast::Expression_const*&,slang::SourceRange>
                              (&compilation->super_BumpAllocator,(Expression *)i,delays,delays + 1,
                               &local_b8);
          return &pDVar12->super_TimingControl;
        }
        assert::assertFailed
                  ("delays[0]",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/Kuree[P]hgdb-rtl/extern/slang/source/ast/TimingControl.cpp"
                   ,0xf0,
                   "static TimingControl &slang::ast::Delay3Control::fromParams(Compilation &, const ParameterValueAssignmentSyntax &, const ASTContext &)"
                  );
      }
      pPVar7 = slang::syntax::SeparatedSyntaxList<slang::syntax::ParamAssignmentSyntax>::operator[]
                         (this,local_70);
      if ((pPVar7->super_SyntaxNode).kind != OrderedParamAssignment) break;
      pSVar8 = &slang::syntax::SeparatedSyntaxList<slang::syntax::ParamAssignmentSyntax>::operator[]
                          (this,local_70)->super_SyntaxNode;
      pOVar9 = slang::syntax::SyntaxNode::as<slang::syntax::OrderedParamAssignmentSyntax>(pSVar8);
      pEVar10 = not_null<slang::syntax::ExpressionSyntax_*>::operator*(&pOVar9->expr);
      bitmask<slang::ast::ASTFlags>::bitmask(&local_90,None);
      iVar4 = Expression::bind((int)pEVar10,(sockaddr *)context,(socklen_t)local_90.m_bits);
      delays[local_70 - 1] = (Expression *)CONCAT44(extraout_var,iVar4);
      pTVar11 = not_null<const_slang::ast::Type_*>::operator->(&delays[local_70 - 1]->type);
      bVar3 = Type::isNumeric(pTVar11);
      if (!bVar3) {
        local_94 = 0x100008;
        pSVar1 = &delays[local_70 - 1]->sourceRange;
        local_a8 = pSVar1->startLoc;
        local_a0 = (delays[local_70 - 1]->sourceRange).endLoc;
        diag = ASTContext::addDiag(context,(DiagCode)0x100008,*pSVar1);
        pTVar11 = not_null<const_slang::ast::Type_*>::operator*(&delays[local_70 - 1]->type);
        ast::operator<<(diag,pTVar11);
        pTVar6 = TimingControl::badCtrl(compilation,(TimingControl *)0x0);
        return pTVar6;
      }
      local_70 = local_70 + 1;
    }
    local_74.subsystem = Expressions;
    local_74.code = 0x4a;
    pSVar8 = &slang::syntax::SeparatedSyntaxList<slang::syntax::ParamAssignmentSyntax>::operator[]
                        (this,local_70)->super_SyntaxNode;
    local_88 = slang::syntax::SyntaxNode::sourceRange(pSVar8);
    ASTContext::addDiag(context,local_74,local_88);
    pTVar6 = TimingControl::badCtrl(compilation,(TimingControl *)0x0);
    return pTVar6;
  }
  sourceRange = slang::syntax::SyntaxNode::sourceRange(&exprs->super_SyntaxNode);
  ASTContext::addDiag(context,(DiagCode)0x4a0007,sourceRange);
  pTVar6 = TimingControl::badCtrl(compilation,(TimingControl *)0x0);
  return pTVar6;
}

Assistant:

TimingControl& Delay3Control::fromParams(Compilation& compilation,
                                         const ParameterValueAssignmentSyntax& exprs,
                                         const ASTContext& context) {
    auto& items = exprs.parameters;
    if (items.size() < 1 || items.size() > 3) {
        context.addDiag(diag::ExpectedNetDelay, exprs.sourceRange());
        return badCtrl(compilation, nullptr);
    }

    const Expression* delays[3] = {nullptr};
    for (size_t i = 0; i < items.size(); i++) {
        if (items[i]->kind != SyntaxKind::OrderedParamAssignment) {
            context.addDiag(diag::ExpectedNetDelay, items[i]->sourceRange());
            return badCtrl(compilation, nullptr);
        }

        delays[i] = &Expression::bind(*items[i]->as<OrderedParamAssignmentSyntax>().expr, context);

        if (!delays[i]->type->isNumeric()) {
            context.addDiag(diag::DelayNotNumeric, delays[i]->sourceRange) << *delays[i]->type;
            return badCtrl(compilation, nullptr);
        }
    }

    ASSERT(delays[0]);
    return *compilation.emplace<Delay3Control>(*delays[0], delays[1], delays[2],
                                               items.sourceRange());
}